

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

void __thiscall
cmCompiledGeneratorExpression::cmCompiledGeneratorExpression
          (cmCompiledGeneratorExpression *this,cmListFileBacktrace *backtrace,string *input)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmGeneratorExpressionLexer l;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> tokens;
  cmGeneratorExpressionParser p;
  cmGeneratorExpressionLexer local_92 [17];
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> local_70;
  cmGeneratorExpressionParser local_58;
  
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  (this->Evaluators).
  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Evaluators).
  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Evaluators).
  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Input)._M_dataplus._M_p = (pointer)&(this->Input).field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Input,pcVar2,pcVar2 + input->_M_string_length);
  p_Var1 = &(this->DependTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header;
  (this->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Output)._M_dataplus._M_p = (pointer)&(this->Output).field_2;
  (this->Output)._M_string_length = 0;
  (this->Output).field_2._M_local_buf[0] = '\0';
  this->HadContextSensitiveCondition = false;
  this->HadHeadSensitiveCondition = false;
  p_Var1 = &(this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->EvaluateForBuildsystem = false;
  cmGeneratorExpressionLexer::cmGeneratorExpressionLexer(local_92);
  cmGeneratorExpressionLexer::Tokenize(&local_70,local_92,&this->Input);
  this->NeedsEvaluation = local_92[0].SawGeneratorExpression;
  if (local_92[0].SawGeneratorExpression == true) {
    cmGeneratorExpressionParser::cmGeneratorExpressionParser(&local_58,&local_70);
    cmGeneratorExpressionParser::Parse(&local_58,&this->Evaluators);
    if (local_58.Tokens.
        super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.Tokens.
                      super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.Tokens.
                            super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.Tokens.
                            super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_70.
      super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

cmCompiledGeneratorExpression::cmCompiledGeneratorExpression(
  cmListFileBacktrace const& backtrace, const std::string& input)
  : Backtrace(backtrace)
  , Input(input)
  , HadContextSensitiveCondition(false)
  , HadHeadSensitiveCondition(false)
  , EvaluateForBuildsystem(false)
{
  cmGeneratorExpressionLexer l;
  std::vector<cmGeneratorExpressionToken> tokens = l.Tokenize(this->Input);
  this->NeedsEvaluation = l.GetSawGeneratorExpression();

  if (this->NeedsEvaluation) {
    cmGeneratorExpressionParser p(tokens);
    p.Parse(this->Evaluators);
  }
}